

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncpy_s.c
# Opt level: O1

int main(void)

{
  errno_t eVar1;
  char s [8];
  char local_10 [8];
  
  builtin_strncpy(local_10,"xxxxxxx",8);
  set_constraint_handler_s(test_handler);
  eVar1 = strncpy_s(local_10,8,"",1);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x45,"strncpy_s( s, 8, \"\", 1 ) == 0");
  }
  if (local_10[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x46,"s[0] == \'\\0\'");
  }
  if (local_10[1] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x47,"s[1] == \'x\'");
  }
  eVar1 = strncpy_s(local_10,8,"abcde",6);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x48,"strncpy_s( s, 8, abcde, 6 ) == 0");
  }
  if (local_10[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x49,"s[0] == \'a\'");
  }
  if (local_10[4] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x4a,"s[4] == \'e\'");
  }
  if (local_10[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x4b,"s[5] == \'\\0\'");
  }
  if (local_10[6] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x4c,"s[6] == \'x\'");
  }
  eVar1 = strncpy_s(local_10,8,"abcde",7);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x4d,"strncpy_s( s, 8, abcde, 7 ) == 0");
  }
  if (local_10[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x4f,"s[5] == \'\\0\'");
  }
  if (local_10[6] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x50,"s[6] == \'x\'");
  }
  eVar1 = strncpy_s(local_10,8,"xxxx",3);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x51,"strncpy_s( s, 8, \"xxxx\", 3 ) == 0");
  }
  if (local_10[0] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x52,"s[0] == \'x\'");
  }
  if (local_10[2] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x53,"s[2] == \'x\'");
  }
  if (local_10[3] != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x54,"s[3] == \'d\'");
  }
  eVar1 = strncpy_s(local_10,8,"abcdefgh",9);
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x57,"strncpy_s( s, 8, \"abcdefgh\", 9 ) != 0");
  }
  eVar1 = strncpy_s(local_10,8,"abcdefgh",9);
  if (eVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x58,"strncpy_s( s, 8, \"abcdefgh\", 9 ) != 0");
  }
  if (HANDLER_CALLS != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncpy_s.c, line %d - %s\n"
           ,0x5a,"HANDLER_CALLS == 2");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strncpy_s( s, 8, "", 1 ) == 0 );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strncpy_s( s, 8, abcde, 6 ) == 0 );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'x' );
    TESTCASE( strncpy_s( s, 8, abcde, 7 ) == 0 );
    /* Different from strncpy()! */
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'x' );
    TESTCASE( strncpy_s( s, 8, "xxxx", 3 ) == 0 );
    TESTCASE( s[0] == 'x' );
    TESTCASE( s[2] == 'x' );
    TESTCASE( s[3] == 'd' );

    /* Overrun. */
    TESTCASE( strncpy_s( s, 8, "abcdefgh", 9 ) != 0 );
    TESTCASE( strncpy_s( s, 8, "abcdefgh", 9 ) != 0 );

    TESTCASE( HANDLER_CALLS == 2 );
#endif
    return TEST_RESULTS;
}